

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::InsertIncludes
          (ConversionStream *this,String *GLSLSource,
          IShaderSourceInputStreamFactory *pSourceStreamFactory)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  uint *puVar3;
  long lVar4;
  int iVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  char *pcVar7;
  void *pvVar8;
  size_type sVar9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  char cVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar17;
  RefCntAutoPtr<Diligent::IFileStream> pIncludeDataStream;
  RefCntAutoPtr<Diligent::DataBlobImpl> pIncludeData;
  String IncludeName;
  String IncludeFileLowercase;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ProcessedIncludes;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  long *local_e8;
  DataBlobImpl *local_e0;
  undefined1 *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  uint *local_b0;
  long local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  uint *local_90;
  long local_88;
  undefined8 local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  IShaderSourceInputStreamFactory *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_70 = pSourceStreamFactory;
  do {
    pcVar7 = (GLSLSource->_M_dataplus)._M_p;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pcVar7 + GLSLSource->_M_string_length);
    _Var10._M_current = (char *)paVar11;
    local_f0._M_current = pcVar7;
    if (GLSLSource->_M_string_length == 0) {
      sVar9 = 0;
      _Var6._M_current = pcVar7;
    }
    else {
      do {
        local_d0._M_dataplus._M_p = (pointer)paVar11;
        _Var6 = Parsing::
                SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                          (&local_f0,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_d0,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
        pcVar7 = (GLSLSource->_M_dataplus)._M_p;
        sVar9 = GLSLSource->_M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_current ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pcVar7 + sVar9)) break;
        local_f0._M_current = _Var6._M_current + 1;
        if (*_Var6._M_current == '#') {
          local_d0._M_dataplus._M_p = (pointer)(pcVar7 + sVar9);
          local_f0 = Parsing::
                     SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                               (&local_f0,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_d0,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
          pcVar7 = (GLSLSource->_M_dataplus)._M_p;
          sVar9 = GLSLSource->_M_string_length;
          _Var10 = _Var6;
          _Var6 = local_f0;
          if (local_f0._M_current == pcVar7 + sVar9) break;
          cVar13 = 'i';
          pcVar15 = "nclude";
          _Var2 = local_f0;
          do {
            pcVar14 = _Var2._M_current + 1;
            if (cVar13 != *_Var2._M_current) goto LAB_002c74ff;
            cVar13 = *pcVar15;
            _Var6._M_current = _Var6._M_current + 1;
          } while ((cVar13 != '\0') &&
                  (pcVar15 = pcVar15 + 1, _Var2._M_current = pcVar14, pcVar14 != pcVar7 + sVar9));
          if (cVar13 == '\0') break;
        }
LAB_002c74ff:
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar7 + sVar9);
        _Var6._M_current = local_f0._M_current;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_f0._M_current != paVar11);
    }
    local_f0._M_current = _Var6._M_current;
    if (local_f0._M_current == pcVar7 + sVar9) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      return;
    }
    local_d0._M_dataplus._M_p = pcVar7 + sVar9;
    local_f0 = Parsing::
               SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (&local_f0,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_d0,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
    if (local_f0._M_current == (GLSLSource->_M_dataplus)._M_p + GLSLSource->_M_string_length) {
      LogError<true,char[40]>
                (false,"InsertIncludes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x2f9,(char (*) [40])"Unexpected EOF after #include directive");
    }
    if ((*local_f0._M_current != '\"') && (*local_f0._M_current != '<')) {
      LogError<true,char[52]>
                (false,"InsertIncludes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x2fd,(char (*) [52])"Missing open quotes or \'<\' after #include directive");
    }
    pcVar7 = (GLSLSource->_M_dataplus)._M_p + GLSLSource->_M_string_length;
    pcVar15 = local_f0._M_current + 1;
    local_f0._M_current = pcVar15;
    if (pcVar15 == pcVar7) {
LAB_002c75e8:
      if (local_f0._M_current == pcVar7) goto LAB_002c75ed;
    }
    else {
      do {
        if ((*local_f0._M_current == '\"') || (*local_f0._M_current == '>')) goto LAB_002c75e8;
        local_f0._M_current = local_f0._M_current + 1;
      } while (local_f0._M_current != pcVar7);
LAB_002c75ed:
      LogError<true,char[55]>
                (false,"InsertIncludes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x307,(char (*) [55])"Missing closing quotes or \'>\' after #include directive");
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_d0,pcVar15,local_f0._M_current);
    local_f0._M_current = local_f0._M_current + 1;
    pcVar1 = (GLSLSource->_M_dataplus)._M_p;
    uVar12 = (long)_Var10._M_current - (long)pcVar1;
    if (pcVar1 + GLSLSource->_M_string_length == local_f0._M_current) {
      GLSLSource->_M_string_length = uVar12;
      pcVar1[uVar12] = '\0';
    }
    else {
      std::__cxx11::string::_M_erase((ulong)GLSLSource,uVar12);
    }
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    lVar4 = local_a8;
    puVar3 = local_b0;
    if (local_a8 != 0) {
      lVar16 = 0;
      do {
        iVar5 = tolower((uint)*(byte *)((long)puVar3 + lVar16));
        *(char *)((long)puVar3 + lVar16) = (char)iVar5;
        lVar16 = lVar16 + 1;
      } while (lVar4 != lVar16);
    }
    local_90 = local_b0;
    if (local_b0 == &local_a0) {
      uStack_78 = uStack_98;
      uStack_74 = uStack_94;
      local_90 = (uint *)&local_80;
    }
    local_80 = CONCAT44(uStack_9c,local_a0);
    local_88 = local_a8;
    local_a8 = 0;
    local_a0 = local_a0 & 0xffffff00;
    local_e0 = (DataBlobImpl *)&local_68;
    local_b0 = &local_a0;
    pVar17 = std::
             _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             ::
             _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                       ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         *)local_e0,&local_90,&local_e0);
    if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_e8 = (long *)0x0;
      local_e0 = (DataBlobImpl *)0x0;
      local_d8 = (undefined1 *)&local_e8;
      (*(local_70->super_IObject)._vptr_IObject[4])(local_70,local_d0._M_dataplus._M_p,&local_e0);
      RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
                ((DoublePtrHelper<Diligent::IFileStream> *)&local_e0);
      if (local_e8 == (long *)0x0) {
        LogError<true,char[29],std::__cxx11::string>
                  (false,"InsertIncludes",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x31c,(char (*) [29])"Failed to open include file ",&local_d0);
      }
      DataBlobImpl::Create((DataBlobImpl *)&local_e0,0,(void *)0x0);
      (**(code **)(*local_e8 + 0x28))();
      pvVar8 = DataBlobImpl::GetConstDataPtr(local_e0,0);
      DataBlobImpl::GetSize(local_e0);
      std::__cxx11::string::replace
                ((ulong)GLSLSource,(long)_Var10._M_current - (long)(GLSLSource->_M_dataplus)._M_p,
                 (char *)0x0,(ulong)pvVar8);
      RefCntAutoPtr<Diligent::DataBlobImpl>::Release
                ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&local_e0);
      if (local_e8 != (long *)0x0) {
        (**(code **)(*local_e8 + 0x10))();
      }
    }
    if (local_90 != (uint *)&local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::InsertIncludes(String& GLSLSource, IShaderSourceInputStreamFactory* pSourceStreamFactory)
{
    // Put all the includes into the set to avoid multiple inclusion
    std::unordered_set<String> ProcessedIncludes;

    try
    {
        do
        {
            // Find the first #include statement
            auto Pos             = GLSLSource.begin();
            auto IncludeStartPos = GLSLSource.end();
            while (Pos != GLSLSource.end())
            {
                // #   include "TestFile.fxh"
                Pos = SkipDelimitersAndComments(Pos, GLSLSource.end());
                if (Pos == GLSLSource.end())
                    break;
                if (*Pos == '#')
                {
                    IncludeStartPos = Pos;
                    // #   include "TestFile.fxh"
                    // ^
                    ++Pos;
                    // #   include "TestFile.fxh"
                    //  ^
                    Pos = SkipDelimitersAndComments(Pos, GLSLSource.end());
                    if (Pos == GLSLSource.end())
                    {
                        // End of the file reached - break
                        break;
                    }
                    // #   include "TestFile.fxh"
                    //     ^
                    if (Parsing::SkipString(Pos, GLSLSource.end(), "include", Pos))
                    {
                        // #   include "TestFile.fxh"
                        //            ^
                        break;
                    }
                    else
                    {
                        // This is not an #include directive:
                        // #define MACRO
                        // Continue search through the file
                    }
                }
                else
                    ++Pos;
            }

            // No more #include found
            if (Pos == GLSLSource.end())
                break;

            // Find open quotes
            Pos = SkipDelimitersAndComments(Pos, GLSLSource.end());
            if (Pos == GLSLSource.end())
                LOG_ERROR_AND_THROW("Unexpected EOF after #include directive");
            // #   include "TestFile.fxh"
            //             ^
            if (*Pos != '\"' && *Pos != '<')
                LOG_ERROR_AND_THROW("Missing open quotes or \'<\' after #include directive");
            ++Pos;
            // #   include "TestFile.fxh"
            //              ^
            auto IncludeNameStartPos = Pos;
            // Find closing quotes
            while (Pos != GLSLSource.end() && *Pos != '\"' && *Pos != '>') ++Pos;
            // #   include "TestFile.fxh"
            //                          ^
            if (Pos == GLSLSource.end())
                LOG_ERROR_AND_THROW("Missing closing quotes or \'>\' after #include directive");

            // Get the name of the include file
            auto IncludeName = String(IncludeNameStartPos, Pos);
            ++Pos;
            // #   include "TestFile.fxh"
            // ^                         ^
            // IncludeStartPos           Pos
            GLSLSource.erase(IncludeStartPos, Pos);

            // Convert the name to lower case
            String IncludeFileLowercase = StrToLower(IncludeName);
            // Insert the lower-case name into the set
            auto It = ProcessedIncludes.insert(IncludeFileLowercase);
            // If the name was actually inserted, which means the include encountered for the first time,
            // replace the text with the file content
            if (It.second)
            {
                RefCntAutoPtr<IFileStream> pIncludeDataStream;
                pSourceStreamFactory->CreateInputStream(IncludeName.c_str(), &pIncludeDataStream);
                if (!pIncludeDataStream)
                    LOG_ERROR_AND_THROW("Failed to open include file ", IncludeName);
                auto pIncludeData = DataBlobImpl::Create();
                pIncludeDataStream->ReadBlob(pIncludeData);

                // Get include text
                const Char* IncludeText = pIncludeData->GetConstDataPtr<Char>();
                size_t      NumSymbols  = pIncludeData->GetSize();

                // Insert the text into source
                GLSLSource.insert(IncludeStartPos - GLSLSource.begin(), IncludeText, NumSymbols);
            }
        } while (true);
    }
    catch (const std::pair<std::string::iterator, const char*>& ErrInfo)
    {
        LOG_ERROR_AND_THROW("Unable to process includes: ", ErrInfo.second);
    }
}